

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

bool __thiscall IR::PropertySymOpnd::IsObjectHeaderInlined(PropertySymOpnd *this)

{
  bool bVar1;
  TypeId typeId;
  JITType *pJVar2;
  JITTypeHandler *this_00;
  bool local_41;
  nullptr_t local_38;
  Type local_30;
  Type local_28;
  JITTypeHolderBase<void> local_20;
  JITTypeHolder type;
  PropertySymOpnd *this_local;
  
  type.t = (Type)this;
  JITTypeHolderBase<void>::JITTypeHolderBase(&local_20,(JITType *)0x0);
  bVar1 = IsMono(this);
  if (bVar1) {
    local_28 = (Type)GetType(this);
    local_20.t = local_28;
  }
  else {
    bVar1 = HasEquivalentTypeSet(this);
    if (bVar1) {
      local_30 = (Type)GetFirstEquivalentType(this);
      local_20.t = local_30;
    }
  }
  local_38 = (nullptr_t)0x0;
  bVar1 = JITTypeHolderBase<void>::operator!=(&local_20,&local_38);
  local_41 = false;
  if (bVar1) {
    pJVar2 = JITTypeHolderBase<void>::operator->(&local_20);
    typeId = JITType::GetTypeId(pJVar2);
    local_41 = Js::DynamicType::Is(typeId);
  }
  if (local_41 == false) {
    this_local._7_1_ = false;
  }
  else {
    pJVar2 = JITTypeHolderBase<void>::operator->(&local_20);
    this_00 = JITType::GetTypeHandler(pJVar2);
    this_local._7_1_ = JITTypeHandler::IsObjectHeaderInlinedTypeHandler(this_00);
  }
  return this_local._7_1_;
}

Assistant:

bool
PropertySymOpnd::IsObjectHeaderInlined() const
{
    JITTypeHolder type(nullptr);
    if (this->IsMono())
    {
        type = this->GetType();
    }
    else if (this->HasEquivalentTypeSet())
    {
        type = this->GetFirstEquivalentType();
    }

    if (type != nullptr && Js::DynamicType::Is(type->GetTypeId()))
    {
        return type->GetTypeHandler()->IsObjectHeaderInlinedTypeHandler();
    }

    return false;
}